

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* nlohmann::json_abi_v3_11_2::
  json_pointer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string_t *reference_string)

{
  long lVar1;
  long lVar2;
  long lVar3;
  parse_error *ppVar4;
  char (*in_R8) [2];
  allocator<char> local_a2;
  allocator<char> local_a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  string_t *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> reference_token;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = __return_storage_ptr__;
  if (reference_string->_M_string_length != 0) {
    if (*(reference_string->_M_dataplus)._M_p != '/') {
      ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
      detail::
      concat<std::__cxx11::string,char_const(&)[54],std::__cxx11::string_const&,char_const(&)[2]>
                (&local_90,(detail *)"JSON pointer must be empty or begin with \'/\' - was: \'",
                 (char (*) [54])reference_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13dfd5,in_R8
                );
      detail::parse_error::create<std::nullptr_t,_0>(ppVar4,0x6b,1,&local_90,(void *)0x0);
      __cxa_throw(ppVar4,&detail::parse_error::typeinfo,detail::exception::~exception);
    }
    local_98 = reference_string;
    lVar1 = std::__cxx11::string::find((char)reference_string,0x2f);
    lVar2 = 1;
    while (lVar2 != 0) {
      std::__cxx11::string::substr((ulong)&reference_token,(ulong)local_98);
      while (lVar2 = std::__cxx11::string::find((char)&reference_token,0x7e), lVar2 != -1) {
        if ((lVar2 == reference_token._M_string_length - 1) ||
           ((reference_token._M_dataplus._M_p[lVar2 + 1] & 0xfeU) != 0x30)) {
          ppVar4 = (parse_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,
                     "escape character \'~\' must be followed with \'0\' or \'1\'",
                     (allocator<char> *)&local_50);
          detail::parse_error::create<std::nullptr_t,_0>(ppVar4,0x6c,0,&local_90,(void *)0x0);
          __cxa_throw(ppVar4,&detail::parse_error::typeinfo,detail::exception::~exception);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"~1",&local_a1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/",&local_a2);
      detail::replace_substring<std::__cxx11::string>(&reference_token,&local_90,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"~0",&local_a1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"~",&local_a2);
      detail::replace_substring<std::__cxx11::string>(&reference_token,&local_90,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_a0,&reference_token);
      std::__cxx11::string::~string((string *)&reference_token);
      lVar3 = std::__cxx11::string::find((char)local_98,0x2f);
      lVar2 = lVar1 + 1;
      lVar1 = lVar3;
    }
  }
  return local_a0;
}

Assistant:

json_pointer& operator/=(const json_pointer& ptr)
    {
        reference_tokens.insert(reference_tokens.end(),
                                ptr.reference_tokens.begin(),
                                ptr.reference_tokens.end());
        return *this;
    }